

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

void Rwt_Trav_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,int *pVolume)

{
  int iVar1;
  
  for (; ((pNode->field_0xb & 0x40) == 0 && (pNode->TravId != p->nTravIds));
      pNode = (Rwt_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe)) {
    pNode->TravId = p->nTravIds;
    iVar1 = *pVolume;
    *pVolume = iVar1 + 1;
    if (*(int *)&pNode->field_0x8 < 0) {
      *pVolume = iVar1 + 2;
    }
    Rwt_Trav_rec(p,(Rwt_Node_t *)((ulong)pNode->p0 & 0xfffffffffffffffe),pVolume);
  }
  return;
}

Assistant:

void Rwt_Trav_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    if ( pNode->fExor )
        (*pVolume)++;
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p0), pVolume );
    Rwt_Trav_rec( p, Rwt_Regular(pNode->p1), pVolume );
}